

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmString.hxx
# Opt level: O2

type cm::operator==(StringOpPlus<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
                    *l,basic_string_view<char,_std::char_traits<char>_> *r)

{
  bool bVar1;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x;
  string local_30;
  
  StringOpPlus::operator_cast_to_string(&local_30,(StringOpPlus *)l);
  __x._M_str = local_30._M_dataplus._M_p;
  __x._M_len = local_30._M_string_length;
  bVar1 = std::operator==(__x,*r);
  std::__cxx11::string::~string((string *)&local_30);
  return bVar1;
}

Assistant:

typename std::enable_if<AsStringView<R>::value, bool>::type operator==(
  StringOpPlus<LL, LR> const& l, R&& r)
{
  return std::string(l) == AsStringView<R>::view(std::forward<R>(r));
}